

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O3

bool pstore::http::check_message_complete<WsServer_Ping_Test::TestBody()::__2,int>
               (anon_class_8_1_65350a3f sender,int io,frame *wsp,opcode *op,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  pointer puVar1;
  undefined8 *puVar2;
  anon_class_8_1_65350a3f sender_00;
  bool bVar3;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  span<const_unsigned_char,__1L> *in_R9;
  opcode io_00;
  long in_FS_OFFSET;
  error_code eVar6;
  error_or<int> eo3;
  error_or<int> local_90;
  long *local_78 [2];
  long local_68 [2];
  error_or<int> local_58;
  extent_type<_1L> local_40;
  pointer local_38;
  
  if (((ulong)wsp & 1) != 0) {
    sender_00.output._4_4_ = 0;
    sender_00.output._0_4_ = io;
    io_00 = *op;
    if (io_00 == text) {
      pvVar5 = payload;
      bVar3 = is_valid_utf8<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
      if (!bVar3) {
        send_close_frame<WsServer_Ping_Test::TestBody()::__2,int>
                  (&local_58,(http *)sender.output,sender_00,0x3ef,(close_status_code)pvVar5);
        if (local_58.has_error_ == false) {
          error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_58);
        }
        else {
          error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_58);
        }
        return false;
      }
      io_00 = *op;
    }
    puVar1 = (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pstore::gsl::details::extent_type<-1L>::extent_type
              (&local_40,
               (long)(payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    pstore::gsl::details::extent_type<-1L>::extent_type(&local_40,local_40.size_);
    local_38 = puVar1;
    send_message<WsServer_Ping_Test::TestBody()::__2,int>
              (&local_90,(http *)sender.output,sender_00,io_00,(opcode)&local_40,in_R9);
    if (local_90.has_error_ == true) {
      eVar6 = error_or<int>::get_error(&local_90);
      (**(code **)(*(long *)eVar6._M_cat + 0x20))(local_78,eVar6._M_cat,eVar6._M_value);
      pstore::details::log_destinations::__tls_init();
      if (*(long *)(in_FS_OFFSET + -8) != 0) {
        pstore::details::log_destinations::__tls_init();
        puVar2 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
        for (puVar4 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar4 != puVar2;
            puVar4 = puVar4 + 1) {
          (**(code **)(*(long *)*puVar4 + 0x50))((long *)*puVar4,3,"Send error: ",local_78[0]);
        }
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
    }
    puVar1 = (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    *op = unknown;
    if (local_90.has_error_ == false) {
      error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_90);
    }
    else {
      error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_90);
    }
  }
  return true;
}

Assistant:

bool check_message_complete (Sender const sender, IO const io, frame const & wsp,
                                     opcode & op, std::vector<std::uint8_t> & payload) {
            if (wsp.fin) {
                // We've got the complete message. If this was a text message, we need to
                // validate the UTF-8 that it contains.
                //
                // "When an endpoint is to interpret a byte stream as UTF-8 but finds that
                // the byte stream is not, in fact, a valid UTF-8 stream, that endpoint MUST
                // _Fail the WebSocket Connection_.
                if (op == opcode::text &&
                    !is_valid_utf8 (std::begin (payload), std::end (payload))) {

                    send_close_frame (sender, io, close_status_code::invalid_payload);
                    return false;
                }

                if (log_received_messages) {
                    std::string str;
                    std::transform (std::begin (payload), std::end (payload),
                                    std::back_inserter (str),
                                    [] (std::uint8_t const v) { return static_cast<char> (v); });
                    log (logger::priority::info, "Received: ", str);
                }

                // This implements a simple echo server ATM.
                error_or<IO> const eo3 = send_message (sender, io, op, gsl::make_span (payload));
                if (!eo3) {
                    log (logger::priority::error, "Send error: ", eo3.get_error ().message ());
                }

                payload.clear ();
                op = opcode::unknown;
            }
            return true;
        }